

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

ON_Brep * __thiscall ON_Hatch::BrepForm(ON_Hatch *this,ON_Brep *brep)

{
  ON_Curve *pOVar1;
  int iVar2;
  ON_PlaneSurface *this_00;
  ON_BrepFace *pOVar3;
  long lVar4;
  ON_Plane *pOVar5;
  ON_Plane *pOVar6;
  long lVar7;
  byte bVar8;
  ON_Curve *edgecurve;
  ON_Interval local_118;
  ON_Interval local_108;
  ON_SimpleArray<ON_Curve_*> bounds;
  ON_BoundingBox bbox;
  ON_Plane plane;
  
  bVar8 = 0;
  if (brep == (ON_Brep *)0x0) {
    brep = ON_Brep::New();
    if (brep == (ON_Brep *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hatch.cpp"
                 ,0x716,"","Unable to get allocate brep.");
      return (ON_Brep *)0x0;
    }
  }
  else {
    ON_Brep::Destroy(brep);
  }
  pOVar5 = &this->m_plane;
  pOVar6 = &plane;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pOVar6->origin).x = (pOVar5->origin).x;
    pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar8 * -0x10 + 8);
    pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  this_00 = (ON_PlaneSurface *)operator_new(0xd0);
  ON_PlaneSurface::ON_PlaneSurface(this_00,&plane);
  lVar4 = (long)(this->m_loops).m_count;
  if (0 < lVar4) {
    iVar2 = -1;
    lVar7 = 0;
    do {
      pOVar1 = (this->m_loops).m_a[lVar7]->m_p2dCurve;
      edgecurve = LoopCurve3d(this,(int)lVar7);
      bounds._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080bda0;
      bounds.m_a = (ON_Curve **)0x0;
      bounds.m_count = 0;
      bounds.m_capacity = 0;
      ON_SimpleArray<ON_Curve_*>::Append(&bounds,&edgecurve);
      if (lVar7 == 0) {
        ON_BoundingBox::ON_BoundingBox(&bbox);
        (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                  (pOVar1,&bbox,&bbox.m_max,0);
        ON_Interval::ON_Interval(&local_108,bbox.m_min.x + -1.0,bbox.m_max.x + 1.0);
        ON_PlaneSurface::SetExtents(this_00,0,local_108,true);
        ON_Interval::ON_Interval(&local_118,bbox.m_min.y + -1.0,bbox.m_max.y + 1.0);
        ON_PlaneSurface::SetExtents(this_00,1,local_118,true);
        iVar2 = ON_Brep::AddSurface(brep,(ON_Surface *)this_00);
        pOVar3 = ON_Brep::NewFace(brep,iVar2);
        iVar2 = pOVar3->m_face_index;
        ON_Brep::NewPlanarFaceLoop(brep,iVar2,outer,&bounds,false);
      }
      else {
        ON_Brep::NewPlanarFaceLoop(brep,iVar2,inner,&bounds,false);
      }
      ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&bounds);
      lVar7 = lVar7 + 1;
    } while (lVar4 != lVar7);
  }
  ON_Brep::SetTolerancesBoxesAndFlags(brep,false,true,true,true,true,true,true,true);
  ON_Plane::~ON_Plane(&plane);
  return brep;
}

Assistant:

ON_Brep* ON_Hatch::BrepForm(ON_Brep* brep) const
{
  if (brep)
    brep->Destroy();

  ON_Brep* newbrep = brep ? brep : ON_Brep::New();

  if (0 == newbrep)
  {
    ON_ERROR("Unable to get allocate brep.");
    return 0;
  }
  brep = newbrep;

  ON_Plane plane = Plane();
  ON_PlaneSurface* srf = new ON_PlaneSurface(plane);
  int srf_i = -1, face_i = -1;

  int loopcount = LoopCount();
  for (int i = 0; i < loopcount; i++)
  {
    const ON_HatchLoop* loop = Loop(i);
    const ON_Curve* loopcurve = loop->Curve();
    ON_Curve* edgecurve = this->LoopCurve3d(i);
    ON_SimpleArray< ON_Curve* > bounds;
    bounds.Append(edgecurve);

    if (i == 0)
    {
      ON_BoundingBox bbox;
      loopcurve->GetBBox(&bbox.m_min.x, &bbox.m_max.x, false);
      srf->SetExtents(0, ON_Interval(bbox.m_min.x - 1.0, bbox.m_max.x + 1.0), true);
      srf->SetExtents(1, ON_Interval(bbox.m_min.y - 1.0, bbox.m_max.y + 1.0), true);
      srf_i = brep->AddSurface(srf);
      ON_BrepFace& face = brep->NewFace(srf_i);
      face_i = face.m_face_index;
      brep->NewPlanarFaceLoop(face_i, ON_BrepLoop::TYPE::outer, bounds, false);
    }
    else
      brep->NewPlanarFaceLoop(face_i, ON_BrepLoop::TYPE::inner, bounds, false);
  }
  brep->SetTolerancesBoxesAndFlags();

  return brep;
}